

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O2

void __thiscall cashew::JSPrinter::printVar(JSPrinter *this,Ref node)

{
  Ref *pRVar1;
  size_t sVar2;
  char *s;
  uint x;
  size_t i;
  ulong uVar3;
  Ref local_40;
  Ref node_local;
  Ref args;
  
  local_40.inst = node.inst;
  emit(this,"var ");
  pRVar1 = Ref::operator[](&local_40,1);
  node_local.inst = pRVar1->inst;
  uVar3 = 0;
  while( true ) {
    sVar2 = cashew::Value::size(node_local.inst);
    if (sVar2 <= uVar3) break;
    if (uVar3 != 0) {
      if (this->pretty == true) {
        emit(this,", ");
      }
      else {
        emit(this,',');
      }
    }
    x = (uint)uVar3;
    pRVar1 = Ref::operator[](&node_local,x);
    pRVar1 = Ref::operator[](pRVar1,0);
    s = cashew::Value::getCString(pRVar1->inst);
    emit(this,s);
    pRVar1 = Ref::operator[](&node_local,x);
    sVar2 = cashew::Value::size(pRVar1->inst);
    if (1 < sVar2) {
      space(this);
      emit(this,'=');
      space(this);
      pRVar1 = Ref::operator[](&node_local,x);
      pRVar1 = Ref::operator[](pRVar1,1);
      print(this,pRVar1->inst);
    }
    uVar3 = uVar3 + 1;
  }
  return;
}

Assistant:

void printVar(Ref node) {
    emit("var ");
    Ref args = node[1];
    for (size_t i = 0; i < args->size(); i++) {
      if (i > 0) {
        (pretty ? emit(", ") : emit(','));
      }
      emit(args[i][0]->getCString());
      if (args[i]->size() > 1) {
        space();
        emit('=');
        space();
        print(args[i][1]);
      }
    }
  }